

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O1

void why_not_use_auto_pointer(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *psVar2;
  element_type *peVar3;
  ostream *poVar4;
  element_type *__tmp;
  element_type *__tmp_3;
  element_type *__tmp_2;
  element_type *__tmp_4;
  element_type *__tmp_1;
  long lVar5;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pwin;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  films [5];
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string *local_60;
  element_type *local_58;
  string *local_50;
  string *local_48;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar1,"The Iron Man","");
  local_88._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68._M_ptr = pbVar1;
  psVar2 = (string *)operator_new(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar2,"The amazing four","");
  local_70._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60 = psVar2;
  peVar3 = (element_type *)operator_new(0x20);
  (peVar3->_M_dataplus)._M_p = (pointer)&peVar3->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)peVar3,"Capital America","");
  local_78._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = peVar3;
  psVar2 = (string *)operator_new(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar2,"The spiderman","");
  local_80._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50 = psVar2;
  psVar2 = (string *)operator_new(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar2,"The superman","");
  local_38._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = psVar2;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_38);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_80);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_78);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_70);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_88);
  peVar3 = local_58;
  local_88._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = (element_type *)0x0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,peVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The mavel movies are:\n",0x16);
  lVar5 = 0;
  do {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(((&local_68)[lVar5]._M_ptr)->_M_dataplus)._M_p,
                        ((&local_68)[lVar5]._M_ptr)->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The winner is ",0xe);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,((local_88._M_ptr)->_M_dataplus)._M_p,
                      (local_88._M_ptr)->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!\n",2);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_88);
  lVar5 = 0x20;
  do {
    std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~auto_ptr((auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_68._M_ptr + lVar5));
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  return;
}

Assistant:

void why_not_use_auto_pointer() {
    using namespace std;

    auto_ptr<string> films[5] = {
            auto_ptr<string>(new string("The Iron Man")),
            auto_ptr<string>(new string("The amazing four")),
            auto_ptr<string>(new string("Capital America")),
            auto_ptr<string>(new string("The spiderman")),
            auto_ptr<string>(new string("The superman")),
    };

    //  when dispose, these two auto pointer will both try to free same memory on heap
    auto_ptr<string> pwin;
    pwin = films[2];  // film[2] lose owner ship， point to a null pointer

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        std::cout << *films[i] << std::endl;
    }
    std::cout << "The winner is " << *pwin << "!\n";
//    cin.get();
}